

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* utils::cfg_parsing(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *__return_storage_ptr__,string *cfg_filename)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  double dVar5;
  allocator<char> local_651;
  key_type local_650;
  allocator<char> local_629;
  key_type local_628;
  undefined1 local_608 [8];
  string x_value2;
  string x_value1;
  istringstream valuestream;
  char local_442 [2];
  char *local_440;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  istringstream local_430 [8];
  istringstream linestream;
  char local_2aa [2];
  char *local_2a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  istream local_288 [8];
  ifstream filestream;
  undefined1 local_80 [8];
  string value;
  string key;
  string line;
  string *cfg_filename_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *param_map;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::unordered_map(__return_storage_ptr__);
  std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  std::ifstream::ifstream(local_288,cfg_filename,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_288,(string *)(key.field_2._M_local_buf + 8));
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_2a0._M_current = (char *)std::__cxx11::string::begin();
      local_2a8 = (char *)std::__cxx11::string::end();
      local_2aa[1] = 0x3d;
      local_2aa[0] = ' ';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_2a0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_2a8,local_2aa + 1,local_2aa);
      std::__cxx11::istringstream::istringstream(local_430,(undefined1 *)((long)&key.field_2 + 8),8)
      ;
      while( true ) {
        piVar3 = std::operator>>((istream *)local_430,(string *)(value.field_2._M_local_buf + 8));
        piVar3 = std::operator>>(piVar3,(string *)local_80);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
        if (!bVar2) break;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&value.field_2 + 8),"x0");
        if (bVar2) {
          local_438._M_current = (char *)std::__cxx11::string::begin();
          local_440 = (char *)std::__cxx11::string::end();
          local_442[1] = 0x2c;
          local_442[0] = ' ';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    (local_438,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_440,local_442 + 1,local_442);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)((long)&x_value1.field_2 + 8),local_80,8);
          std::__cxx11::string::string((string *)(x_value2.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_608);
          while( true ) {
            piVar3 = std::operator>>((istream *)(x_value1.field_2._M_local_buf + 8),
                                     (string *)(x_value2.field_2._M_local_buf + 8));
            piVar3 = std::operator>>(piVar3,(string *)local_608);
            bVar2 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
            if (!bVar2) break;
            dVar5 = std::__cxx11::stod((string *)((long)&x_value2.field_2 + 8),(size_t *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_628,"x0:1",&local_629);
            pmVar4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[](__return_storage_ptr__,&local_628);
            *pmVar4 = dVar5;
            std::__cxx11::string::~string((string *)&local_628);
            std::allocator<char>::~allocator(&local_629);
            dVar5 = std::__cxx11::stod((string *)local_608,(size_t *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_650,"x0:2",&local_651);
            pmVar4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[](__return_storage_ptr__,&local_650);
            *pmVar4 = dVar5;
            std::__cxx11::string::~string((string *)&local_650);
            std::allocator<char>::~allocator(&local_651);
          }
          std::__cxx11::string::~string((string *)local_608);
          std::__cxx11::string::~string((string *)(x_value2.field_2._M_local_buf + 8));
          std::__cxx11::istringstream::~istringstream
                    ((istringstream *)(x_value1.field_2._M_local_buf + 8));
        }
        else {
          dVar5 = std::__cxx11::stod((string *)local_80,(size_t *)0x0);
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)((long)&value.field_2 + 8));
          *pmVar4 = dVar5;
        }
      }
      std::__cxx11::istringstream::~istringstream(local_430);
    }
  }
  std::ifstream::~ifstream(local_288);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<string, double> utils::cfg_parsing(string cfg_filename){
    std::unordered_map<string, double> param_map;
    string line;
    string key;
    string value;
    std::ifstream filestream(cfg_filename);
    if (filestream.is_open()) {
        while (std::getline(filestream, line)) {
            std::replace(line.begin(), line.end(), '=', ' ');
            std::istringstream linestream(line);
            while (linestream >> key >> value){
                if (key == "x0"){
                    std::replace(value.begin(), value.end(), ',', ' ');
                    std::istringstream valuestream(value);
                    string x_value1, x_value2;
                    while (valuestream >> x_value1 >> x_value2){
                        param_map["x0:1"]=stod(x_value1);
                        param_map["x0:2"]=stod(x_value2);
                    }
                }
                else
                    param_map[key]=stod(value);    
    
            } 
                
            
        }
    }
    return param_map;
}